

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_tcp_recvall(QcSocket *socket,char *recvbuf,int len)

{
  ssize_t sVar1;
  uint uVar2;
  
  sVar1 = recv(socket->sockfd,recvbuf,(long)len,0x4000);
  if (-1 < (int)sVar1) {
    uVar2 = 0;
    do {
      if ((int)sVar1 == 0) {
        return 0;
      }
      uVar2 = uVar2 + (int)sVar1;
      if (len - uVar2 == 0 || len < (int)uVar2) {
        return len;
      }
      sVar1 = recv(socket->sockfd,recvbuf + uVar2,(long)(int)(len - uVar2),0x4000);
    } while (-1 < (int)sVar1);
  }
  _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xfb,"tcp recv(in recvall) failed");
  return -1;
}

Assistant:

int qc_tcp_recvall(QcSocket *socket, char *recvbuf, int len)
{
    int bytes, rcved=0, torcv=0;

    torcv = len;
    while(1)
    {
        bytes = (int)recv(socket->sockfd, recvbuf+rcved, torcv, MSG_NOSIGNAL);
        if(bytes < 0)
        {
            qc_error("tcp recv(in recvall) failed");
            return -1;
        }
        else if(0 == bytes)
            return 0;  /*Connection closed*/

        rcved += bytes;
        if(rcved < len)
        {
            torcv = len - rcved;
            continue;
        }
        else
            return len;
    }
}